

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OneHotEncoder.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::OneHotEncoder::MergeFrom(OneHotEncoder *this,OneHotEncoder *from)

{
  void *pvVar1;
  LogMessage *other;
  StringVector *pSVar2;
  Int64Vector *pIVar3;
  StringVector *from_00;
  Int64Vector *from_01;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/build_O1/mlmodel/format/OneHotEncoder.pb.cc"
               ,0x16d);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,other);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  if (from->outputsparse_ == true) {
    this->outputsparse_ = true;
  }
  if (from->handleunknown_ != 0) {
    this->handleunknown_ = from->handleunknown_;
  }
  if (from->_oneof_case_[0] == 2) {
    if (this->_oneof_case_[0] != 2) {
      clear_CategoryType(this);
      this->_oneof_case_[0] = 2;
      pIVar3 = (Int64Vector *)operator_new(0x28);
      Int64Vector::Int64Vector(pIVar3);
      (this->CategoryType_).int64categories_ = pIVar3;
    }
    pIVar3 = (this->CategoryType_).int64categories_;
    if (from->_oneof_case_[0] == 2) {
      from_01 = (from->CategoryType_).int64categories_;
    }
    else {
      from_01 = Int64Vector::default_instance();
    }
    Int64Vector::MergeFrom(pIVar3,from_01);
  }
  else if (from->_oneof_case_[0] == 1) {
    if (this->_oneof_case_[0] != 1) {
      clear_CategoryType(this);
      this->_oneof_case_[0] = 1;
      pSVar2 = (StringVector *)operator_new(0x30);
      StringVector::StringVector(pSVar2);
      (this->CategoryType_).stringcategories_ = pSVar2;
    }
    pSVar2 = (this->CategoryType_).stringcategories_;
    if (from->_oneof_case_[0] == 1) {
      from_00 = (from->CategoryType_).stringcategories_;
    }
    else {
      from_00 = StringVector::default_instance();
    }
    StringVector::MergeFrom(pSVar2,from_00);
  }
  return;
}

Assistant:

void OneHotEncoder::MergeFrom(const OneHotEncoder& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.OneHotEncoder)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  if (from.outputsparse() != 0) {
    set_outputsparse(from.outputsparse());
  }
  if (from.handleunknown() != 0) {
    set_handleunknown(from.handleunknown());
  }
  switch (from.CategoryType_case()) {
    case kStringCategories: {
      mutable_stringcategories()->::CoreML::Specification::StringVector::MergeFrom(from.stringcategories());
      break;
    }
    case kInt64Categories: {
      mutable_int64categories()->::CoreML::Specification::Int64Vector::MergeFrom(from.int64categories());
      break;
    }
    case CATEGORYTYPE_NOT_SET: {
      break;
    }
  }
}